

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O2

void __thiscall
Assimp::IFC::Schema_2x3::IfcFlowMovingDevice::IfcFlowMovingDevice(IfcFlowMovingDevice *this)

{
  *(undefined ***)&(this->super_IfcDistributionFlowElement).field_0x168 = &PTR__Object_00814a00;
  *(undefined8 *)&this->field_0x170 = 0;
  *(char **)&this->field_0x178 = "IfcFlowMovingDevice";
  IfcDistributionFlowElement::IfcDistributionFlowElement
            (&this->super_IfcDistributionFlowElement,&PTR_construction_vtable_24__0084b180);
  *(undefined8 *)
   &(this->super_IfcDistributionFlowElement).super_IfcDistributionElement.super_IfcElement.
    super_IfcProduct.super_IfcObject = 0x84b028;
  *(undefined8 *)&(this->super_IfcDistributionFlowElement).field_0x168 = 0x84b168;
  *(undefined8 *)
   &(this->super_IfcDistributionFlowElement).super_IfcDistributionElement.super_IfcElement.
    super_IfcProduct.super_IfcObject.field_0x88 = 0x84b050;
  (this->super_IfcDistributionFlowElement).super_IfcDistributionElement.super_IfcElement.
  super_IfcProduct.super_IfcObject.super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObject,_1UL>.
  _vptr_ObjectHelper = (_func_int **)0x84b078;
  *(undefined8 *)
   &(this->super_IfcDistributionFlowElement).super_IfcDistributionElement.super_IfcElement.
    super_IfcProduct.super_IfcObject.field_0xd0 = 0x84b0a0;
  *(undefined8 *)
   &(this->super_IfcDistributionFlowElement).super_IfcDistributionElement.super_IfcElement.
    super_IfcProduct.field_0x100 = 0x84b0c8;
  *(undefined8 *)
   &(this->super_IfcDistributionFlowElement).super_IfcDistributionElement.super_IfcElement.
    field_0x138 = 0x84b0f0;
  *(undefined8 *)
   &(this->super_IfcDistributionFlowElement).super_IfcDistributionElement.super_IfcElement.
    field_0x148 = 0x84b118;
  *(undefined8 *)&(this->super_IfcDistributionFlowElement).super_IfcDistributionElement.field_0x158
       = 0x84b140;
  return;
}

Assistant:

IfcFlowMovingDevice() : Object("IfcFlowMovingDevice") {}